

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O3

void __thiscall
duckdb::roaring::CompressedArrayContainerScanState<true>::LoadNextValue
          (CompressedArrayContainerScanState<true> *this)

{
  byte bVar1;
  ulong uVar2;
  ushort uVar3;
  ulong uVar4;
  byte bVar5;
  uint8_t uVar6;
  
  uVar2 = (this->super_ArrayContainerScanState<true>).array_index;
  if ((this->super_ArrayContainerScanState<true>).count <= uVar2) {
    (this->super_ArrayContainerScanState<true>).finished = true;
    return;
  }
  bVar1 = (this->segment).index;
  uVar4 = (ulong)bVar1;
  bVar5 = (this->segment).count;
  if (uVar4 < 8) {
    uVar6 = bVar1 + 1;
    do {
      if (bVar5 < (this->segment).segments[uVar4]) goto LAB_0056b74e;
      (this->segment).count = '\0';
      uVar4 = uVar4 + 1;
      (this->segment).index = uVar6;
      uVar6 = uVar6 + '\x01';
      bVar5 = 0;
    } while (uVar6 != '\t');
    uVar4 = 8;
  }
LAB_0056b74e:
  (this->segment).count = bVar5 + 1;
  uVar3 = (ushort)(((uint)uVar4 & 0xff) << 8);
  (this->super_ArrayContainerScanState<true>).value = uVar3;
  (this->super_ArrayContainerScanState<true>).value =
       (this->super_ArrayContainerScanState<true>).data[uVar2] | uVar3;
  (this->super_ArrayContainerScanState<true>).array_index = uVar2 + 1;
  return;
}

Assistant:

void LoadNextValue() override {
		if (this->array_index >= this->count) {
			this->finished = true;
			return;
		}
		this->value = segment++;
		this->value += reinterpret_cast<uint8_t *>(this->data)[this->array_index];
		this->array_index++;
	}